

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ObjComputeEdgeDelay2
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              Vec_Int_t *vFanMax1,Vec_Int_t *vFanMax2,Vec_Int_t *vCountMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int Addition;
  int Addition_00;
  long lVar7;
  int iObj_00;
  int iVar8;
  
  Vec_IntWriteEntry(vEdge1,iObj,0);
  Vec_IntWriteEntry(vEdge2,iObj,0);
  iVar1 = Vec_IntEntry(vDelay,iObj);
  iVar2 = Vec_IntEntry(vCountMax,iObj);
  iVar8 = 0;
  if (iVar1 == 0) goto LAB_001e2930;
  iVar8 = iVar1;
  if (iVar2 == 2) {
    iVar2 = Vec_IntEntry(vFanMax1,iObj);
    iVar3 = Vec_IntEntry(vFanMax2,iObj);
    uVar4 = Gia_ObjEdgeCount(iVar2,vEdge1,vEdge2);
    uVar5 = Gia_ObjEdgeCount(iVar3,vEdge1,vEdge2);
    if ((1 < uVar4) || (1 < uVar5)) goto LAB_001e2930;
    Gia_ObjEdgeAdd(iVar2,iObj,vEdge1,vEdge2);
    Gia_ObjEdgeAdd(iVar3,iObj,vEdge1,vEdge2);
    iObj_00 = iObj;
  }
  else {
    if (iVar2 != 1) goto LAB_001e2930;
    iVar3 = Vec_IntEntry(vFanMax1,iObj);
    uVar4 = Gia_ObjEdgeCount(iVar3,vEdge1,vEdge2);
    iObj_00 = iVar3;
    iVar2 = iObj;
    if (1 < uVar4) goto LAB_001e2930;
  }
  Gia_ObjEdgeAdd(iObj_00,iVar2,vEdge1,vEdge2);
  Gia_ObjEdgeAdd(iObj,iVar3,vEdge1,vEdge2);
  iVar8 = iVar1 + -1;
LAB_001e2930:
  Vec_IntWriteEntry(vDelay,iObj,iVar8);
  if ((p->vMapping == (Vec_Int_t *)0x0) || (iVar1 = Gia_ObjIsLut(p,iObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsLut2(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x235,
                    "int Gia_ObjComputeEdgeDelay2(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (iVar1 = 0; iVar2 = Gia_ObjLutSize2(p,iObj), iVar1 < iVar2; iVar1 = iVar1 + 1) {
      iVar2 = Gia_ObjLutFanin2(p,iObj,iVar1);
      iVar3 = Vec_IntEntry(vDelay,iVar2);
      if (iVar8 < iVar3) {
        if (iVar3 == iVar8 + 1) {
          Vec_IntWriteEntry(vFanMax2,iVar2,iObj);
          Vec_IntAddToEntry(vCountMax,iVar2,Addition_00);
        }
      }
      else {
        Vec_IntWriteEntry(vDelay,iVar2,iVar8 + 1);
        Vec_IntWriteEntry(vFanMax1,iVar2,iObj);
        Vec_IntWriteEntry(vCountMax,iVar2,1);
      }
    }
  }
  else {
    for (lVar7 = 0; iVar1 = Gia_ObjLutSize(p,iObj), lVar7 < iVar1; lVar7 = lVar7 + 1) {
      piVar6 = Gia_ObjLutFanins(p,iObj);
      iVar1 = piVar6[lVar7];
      iVar2 = Vec_IntEntry(vDelay,iVar1);
      if (iVar8 < iVar2) {
        if (iVar2 == iVar8 + 1) {
          Vec_IntWriteEntry(vFanMax2,iVar1,iObj);
          Vec_IntAddToEntry(vCountMax,iVar1,Addition);
        }
      }
      else {
        Vec_IntWriteEntry(vDelay,iVar1,iVar8 + 1);
        Vec_IntWriteEntry(vFanMax1,iVar1,iObj);
        Vec_IntWriteEntry(vCountMax,iVar1,1);
      }
    }
  }
  return iVar8;
}

Assistant:

int Gia_ObjComputeEdgeDelay2( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, Vec_Int_t * vFanMax1, Vec_Int_t * vFanMax2, Vec_Int_t * vCountMax )
{
    int i, iFan, DelayFanin, Status1, Status2;
    int DelayMax = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    // analyze this node
    DelayMax = Vec_IntEntry( vDelay, iObj );
    nCountMax = Vec_IntEntry( vCountMax, iObj );
    if ( DelayMax == 0 )
    {}
    else if ( nCountMax == 1 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    else if ( nCountMax == 2 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        iFanMax2 = Vec_IntEntry( vFanMax2, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    // computed DelayMax at this point
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else assert( 0 );
    return DelayMax;
}